

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

ByteData *
cfd::core::GetPsbtInput
          (ByteData *__return_storage_ptr__,ByteData *key_data,wally_psbt_input *input,bool *is_find
          )

{
  wally_tx *tx_00;
  wally_tx_witness_item *pwVar1;
  wally_map_item *pwVar2;
  CfdException *pCVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  uint64_t value;
  bool bVar7;
  long lStack_130;
  allocator local_119;
  size_t index;
  int local_110;
  undefined4 uStack_10c;
  char *local_108;
  Transaction tx;
  Pubkey pk;
  size_t index_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  ByteData::GetBytes(&key,key_data);
  if (is_find != (bool *)0x0) {
    *is_find = false;
  }
  if (8 < *key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start) {
    index = 0;
    ::std::__cxx11::string::string((string *)&tx,"input unknowns",(allocator *)&pk);
    FindPsbtMap(&input->unknowns,&key,(string *)&tx,&index);
    ::std::__cxx11::string::~string((string *)&tx);
    if (is_find != (bool *)0x0) {
      *is_find = true;
    }
    pwVar2 = (input->unknowns).items;
    ByteData::ByteData(__return_storage_ptr__,pwVar2[index].value,(uint32_t)pwVar2[index].value_len)
    ;
    goto LAB_002f8553;
  }
  lVar6 = (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  switch(*key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
  case '\0':
    if (lVar6 != 1) {
      tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x51ab2f;
      tx.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x4b6;
      tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_289d82;
      logger::warn<>((CfdSourceLocation *)&tx,"psbt invalid key format.");
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&tx,"psbt invalid key format error.",(allocator *)&index);
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    tx_00 = input->utxo;
    if (tx_00 != (wally_tx *)0x0) {
      if (is_find != (bool *)0x0) {
        *is_find = true;
      }
      ConvertBitcoinTxFromWally((ByteData *)&index,tx_00,false);
      Transaction::Transaction(&tx,(ByteData *)&index);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&index);
      AbstractTransaction::GetData(__return_storage_ptr__,&tx.super_AbstractTransaction);
      Transaction::~Transaction(&tx);
      goto LAB_002f8553;
    }
    if (is_find == (bool *)0x0) {
      index = (long)
              "//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_psbt.cpp"
              + 0x67;
      local_110 = 0x4bf;
      local_108 = "GetPsbtInput";
      ByteData::GetHex_abi_cxx11_((string *)&tx,key_data);
      logger::warn<std::__cxx11::string>
                ((CfdSourceLocation *)&index,"psbt target {} not found.",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tx);
      ::std::__cxx11::string::~string((string *)&tx);
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ByteData::GetHex_abi_cxx11_((string *)&pk,key_data);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
                       "psbt target key ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pk);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tx,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
                       " not found error.");
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    break;
  case '\x01':
    if (lVar6 != 1) {
      tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x51ab2f;
      tx.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x4c6;
      tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_289d82;
      logger::warn<>((CfdSourceLocation *)&tx,"psbt invalid key format.");
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&tx,"psbt invalid key format error.",(allocator *)&index);
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (input->witness_utxo != (wally_tx_output *)0x0) {
      if (is_find != (bool *)0x0) {
        *is_find = true;
      }
      Serializer::Serializer((Serializer *)&tx);
      Serializer::AddDirectNumber((Serializer *)&tx,input->witness_utxo->satoshi);
      ByteData::ByteData((ByteData *)&index,input->witness_utxo->script,
                         (uint32_t)input->witness_utxo->script_len);
      Serializer::AddVariableBuffer((Serializer *)&tx,(ByteData *)&index);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&index);
      Serializer::Output(__return_storage_ptr__,(Serializer *)&tx);
LAB_002f81fc:
      Serializer::~Serializer((Serializer *)&tx);
      goto LAB_002f8553;
    }
    if (is_find == (bool *)0x0) {
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ByteData::GetHex_abi_cxx11_((string *)&pk,key_data);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
                       "psbt target key ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pk);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tx,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
                       " not found error.");
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    break;
  case '\x02':
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&index,lVar6 - 1,
               (allocator_type *)&tx);
    sVar5 = CONCAT44(uStack_10c,local_110) - index;
    if (sVar5 != 0) {
      memcpy((void *)index,
             key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 1,sVar5);
    }
    ByteData::ByteData((ByteData *)&local_48,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&index);
    Pubkey::Pubkey(&pk,(ByteData *)&local_48);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
    Pubkey::GetData((ByteData *)&tx,&pk);
    ByteData::GetBytes(&pk_bytes,(ByteData *)&tx);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tx);
    index_1 = 0;
    ::std::__cxx11::string::string((string *)&tx,"input signatures",&local_119);
    FindPsbtMap(&input->signatures,&pk_bytes,(string *)&tx,&index_1);
    ::std::__cxx11::string::~string((string *)&tx);
    if (is_find != (bool *)0x0) {
      *is_find = true;
    }
    pwVar2 = (input->signatures).items;
    ByteData::ByteData(__return_storage_ptr__,pwVar2[index_1].value,
                       (uint32_t)pwVar2[index_1].value_len);
    goto LAB_002f80d6;
  case '\x03':
    if (lVar6 != 1) {
      tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x51ab2f;
      tx.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x4ee;
      tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_289d82;
      logger::warn<>((CfdSourceLocation *)&tx,"psbt invalid key format.");
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&tx,"psbt invalid key format error.",(allocator *)&index);
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (input->sighash != 0) {
      if (is_find != (bool *)0x0) {
        *is_find = true;
      }
      Serializer::Serializer((Serializer *)&tx);
      Serializer::AddDirectNumber((Serializer *)&tx,input->sighash);
      Serializer::Output(__return_storage_ptr__,(Serializer *)&tx);
      goto LAB_002f81fc;
    }
    if (is_find == (bool *)0x0) {
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ByteData::GetHex_abi_cxx11_((string *)&pk,key_data);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
                       "psbt target key ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pk);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tx,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
                       " not found error.");
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    break;
  case '\x04':
    if (lVar6 != 1) {
      tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x51ab2f;
      tx.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x4ff;
      tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_289d82;
      logger::warn<>((CfdSourceLocation *)&tx,"psbt invalid key format.");
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&tx,"psbt invalid key format error.",(allocator *)&index);
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    sVar4 = input->redeem_script_len;
    if (sVar4 != 0) {
      lStack_130 = 0x10;
LAB_002f7fbb:
      if (is_find != (bool *)0x0) {
        *is_find = true;
      }
      ByteData::ByteData(__return_storage_ptr__,*(uint8_t **)((long)&input->utxo + lStack_130),
                         (uint32_t)sVar4);
      goto LAB_002f8553;
    }
    if (is_find == (bool *)0x0) {
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ByteData::GetHex_abi_cxx11_((string *)&pk,key_data);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
                       "psbt target key ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pk);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tx,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
                       " not found error.");
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    break;
  case '\x05':
    if (lVar6 != 1) {
      tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x51ab2f;
      tx.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x50f;
      tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_289d82;
      logger::warn<>((CfdSourceLocation *)&tx,"psbt invalid key format.");
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&tx,"psbt invalid key format error.",(allocator *)&index);
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    sVar4 = input->witness_script_len;
    if (sVar4 != 0) {
      lStack_130 = 0x20;
      goto LAB_002f7fbb;
    }
    if (is_find == (bool *)0x0) {
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ByteData::GetHex_abi_cxx11_((string *)&pk,key_data);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
                       "psbt target key ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pk);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tx,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
                       " not found error.");
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    break;
  case '\x06':
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&index,lVar6 - 1,
               (allocator_type *)&tx);
    sVar5 = CONCAT44(uStack_10c,local_110) - index;
    if (sVar5 != 0) {
      memcpy((void *)index,
             key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 1,sVar5);
    }
    ByteData::ByteData((ByteData *)&local_60,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&index);
    Pubkey::Pubkey(&pk,(ByteData *)&local_60);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
    Pubkey::GetData((ByteData *)&tx,&pk);
    ByteData::GetBytes(&pk_bytes,(ByteData *)&tx);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tx);
    index_1 = 0;
    ::std::__cxx11::string::string((string *)&tx,"input bip32 pubkey",&local_119);
    FindPsbtMap(&input->keypaths,&pk_bytes,(string *)&tx,&index_1);
    ::std::__cxx11::string::~string((string *)&tx);
    if (is_find != (bool *)0x0) {
      *is_find = true;
    }
    pwVar2 = (input->keypaths).items;
    ByteData::ByteData(__return_storage_ptr__,pwVar2[index_1].value,
                       (uint32_t)pwVar2[index_1].value_len);
LAB_002f80d6:
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&pk_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&index);
    goto LAB_002f8553;
  case '\a':
    if (lVar6 != 1) {
      tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x51ab2f;
      tx.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x533;
      tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_289d82;
      logger::warn<>((CfdSourceLocation *)&tx,"psbt invalid key format.");
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&tx,"psbt invalid key format error.",(allocator *)&index);
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    sVar4 = input->final_scriptsig_len;
    if (sVar4 != 0) {
      lStack_130 = 0x30;
      goto LAB_002f7fbb;
    }
    if (is_find == (bool *)0x0) {
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ByteData::GetHex_abi_cxx11_((string *)&pk,key_data);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
                       "psbt target key ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pk);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tx,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
                       " not found error.");
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    break;
  case '\b':
    if (lVar6 != 1) {
      tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x51ab2f;
      tx.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x543;
      tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_289d82;
      logger::warn<>((CfdSourceLocation *)&tx,"psbt invalid key format.");
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&tx,"psbt invalid key format error.",(allocator *)&index);
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (input->final_witness != (wally_tx_witness_stack *)0x0) {
      if (is_find != (bool *)0x0) {
        *is_find = true;
      }
      Serializer::Serializer((Serializer *)&tx);
      value = input->final_witness->num_items;
      Serializer::AddVariableInt((Serializer *)&tx,value);
      lVar6 = 8;
      while (bVar7 = value != 0, value = value - 1, bVar7) {
        pwVar1 = input->final_witness->items;
        ByteData::ByteData((ByteData *)&index,*(uint8_t **)((long)pwVar1 + lVar6 + -8),
                           *(uint32_t *)((long)&pwVar1->witness + lVar6));
        Serializer::AddVariableBuffer((Serializer *)&tx,(ByteData *)&index);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&index);
        lVar6 = lVar6 + 0x10;
      }
      Serializer::Output(__return_storage_ptr__,(Serializer *)&tx);
      goto LAB_002f81fc;
    }
    if (is_find == (bool *)0x0) {
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ByteData::GetHex_abi_cxx11_((string *)&pk,key_data);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
                       "psbt target key ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pk);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tx,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
                       " not found error.");
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  ByteData::ByteData(__return_storage_ptr__);
LAB_002f8553:
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

static ByteData GetPsbtInput(
    const ByteData &key_data, const struct wally_psbt_input *input,
    bool *is_find) {
  const auto key = key_data.GetBytes();
  if (is_find != nullptr) *is_find = false;
  bool has_key_1byte = (key.size() == 1);
  if (key[0] == Psbt::kPsbtInputNonWitnessUtxo) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (input->utxo != nullptr) {
      if (is_find != nullptr) *is_find = true;
      Transaction tx(ConvertBitcoinTxFromWally(input->utxo, false));
      return tx.GetData();
    } else if (is_find == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt target {} not found.", key_data.GetHex());
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt target key " + key_data.GetHex() + " not found error.");
    }
  } else if (key[0] == Psbt::kPsbtInputWitnessUtxo) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    // TODO(k-matsuzawa) need endian support.
    if (input->witness_utxo != nullptr) {
      if (is_find != nullptr) *is_find = true;
      Serializer builder;
      builder.AddDirectNumber(input->witness_utxo->satoshi);
      builder.AddVariableBuffer(ByteData(
          input->witness_utxo->script,
          static_cast<uint32_t>(input->witness_utxo->script_len)));
      return builder.Output();
    } else if (is_find == nullptr) {
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt target key " + key_data.GetHex() + " not found error.");
    }
  } else if (key[0] == Psbt::kPsbtInputPartialSig) {
    std::vector<uint8_t> pubkey(key.size() - 1);
    if (pubkey.size() != 0) {
      memcpy(pubkey.data(), &key.data()[1], pubkey.size());
    }
    Pubkey pk(pubkey);
    auto pk_bytes = pk.GetData().GetBytes();
    size_t index = 0;
    try {
      FindPsbtMap(&input->signatures, pk_bytes, "input signatures", &index);
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          input->signatures.items[index].value,
          static_cast<uint32_t>(input->signatures.items[index].value_len));
    } catch (const CfdException &except) {
      if ((is_find == nullptr) ||
          (except.GetErrorCode() != kCfdIllegalArgumentError)) {
        throw except;
      }
    }
  } else if (key[0] == Psbt::kPsbtInputSighashType) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (input->sighash != 0) {
      if (is_find != nullptr) *is_find = true;
      // TODO(k-matsuzawa) need endian support.
      Serializer builder;
      builder.AddDirectNumber(input->sighash);
      return builder.Output();
    } else if (is_find == nullptr) {
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt target key " + key_data.GetHex() + " not found error.");
    }
  } else if (key[0] == Psbt::kPsbtInputRedeemScript) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (input->redeem_script_len != 0) {
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          input->redeem_script,
          static_cast<uint32_t>(input->redeem_script_len));
    } else if (is_find == nullptr) {
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt target key " + key_data.GetHex() + " not found error.");
    }
  } else if (key[0] == Psbt::kPsbtInputWitnessScript) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (input->witness_script_len != 0) {
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          input->witness_script,
          static_cast<uint32_t>(input->witness_script_len));
    } else if (is_find == nullptr) {
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt target key " + key_data.GetHex() + " not found error.");
    }
  } else if (key[0] == Psbt::kPsbtInputBip32Derivation) {
    std::vector<uint8_t> pubkey(key.size() - 1);
    if (pubkey.size() != 0) {
      memcpy(pubkey.data(), &key.data()[1], pubkey.size());
    }
    Pubkey pk(pubkey);
    auto pk_bytes = pk.GetData().GetBytes();
    size_t index = 0;
    try {
      FindPsbtMap(&input->keypaths, pk_bytes, "input bip32 pubkey", &index);
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          input->keypaths.items[index].value,
          static_cast<uint32_t>(input->keypaths.items[index].value_len));
    } catch (const CfdException &except) {
      if ((is_find == nullptr) ||
          (except.GetErrorCode() != kCfdIllegalArgumentError)) {
        throw except;
      }
    }
  } else if (key[0] == Psbt::kPsbtInputFinalScriptsig) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (input->final_scriptsig_len != 0) {
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          input->final_scriptsig,
          static_cast<uint32_t>(input->final_scriptsig_len));
    } else if (is_find == nullptr) {
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt target key " + key_data.GetHex() + " not found error.");
    }
  } else if (key[0] == Psbt::kPsbtInputFinalScriptWitness) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (input->final_witness != nullptr) {
      if (is_find != nullptr) *is_find = true;
      Serializer builder;
      size_t num = input->final_witness->num_items;
      builder.AddVariableInt(num);
      for (uint64_t idx = 0; idx < num; ++idx) {
        builder.AddVariableBuffer(ByteData(
            input->final_witness->items[idx].witness,
            static_cast<uint32_t>(
                input->final_witness->items[idx].witness_len)));
      }
      return builder.Output();
    } else if (is_find == nullptr) {
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt target key " + key_data.GetHex() + " not found error.");
    }
  } else {
    size_t index = 0;
    try {
      FindPsbtMap(&input->unknowns, key, "input unknowns", &index);
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          input->unknowns.items[index].value,
          static_cast<uint32_t>(input->unknowns.items[index].value_len));
    } catch (const CfdException &except) {
      if ((is_find == nullptr) ||
          (except.GetErrorCode() != kCfdIllegalArgumentError)) {
        throw except;
      }
    }
  }
  return ByteData();
}